

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O3

void __thiscall
spdlog::sinks::
daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::daily_filename_calculator>::
daily_file_sink(daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::daily_filename_calculator>
                *this,filename_t *base_filename,int rotation_hour,int rotation_minute,bool truncate,
               uint16_t max_files,file_event_handlers *event_handlers)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  time_point tVar5;
  filename_t filename;
  time_t tnow;
  filename_t local_b0;
  string local_90;
  long local_70;
  tm local_68;
  
  base_sink<spdlog::details::null_mutex>::base_sink
            (&this->super_base_sink<spdlog::details::null_mutex>);
  (this->super_base_sink<spdlog::details::null_mutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__daily_file_sink_0019fb80;
  paVar1 = &(this->base_filename_).field_2;
  (this->base_filename_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (base_filename->_M_dataplus)._M_p;
  paVar2 = &base_filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&base_filename->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->base_filename_).field_2 + 8) = uVar4;
  }
  else {
    (this->base_filename_)._M_dataplus._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->base_filename_)._M_string_length = base_filename->_M_string_length;
  (base_filename->_M_dataplus)._M_p = (pointer)paVar2;
  base_filename->_M_string_length = 0;
  (base_filename->field_2)._M_local_buf[0] = '\0';
  this->rotation_h_ = rotation_hour;
  this->rotation_m_ = rotation_minute;
  (this->rotation_tp_).__d.__r = 0;
  details::file_helper::file_helper(&this->file_helper_,event_handlers);
  this->truncate_ = truncate;
  this->max_files_ = max_files;
  (this->filenames_q_).max_items_ = 0;
  (this->filenames_q_).head_ = 0;
  (this->filenames_q_).tail_ = 0;
  (this->filenames_q_).overrun_counter_ = 0;
  (this->filenames_q_).v_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filenames_q_).v_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filenames_q_).v_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((uint)rotation_hour < 0x18) && ((uint)rotation_minute < 0x3c)) {
    local_70 = std::chrono::_V2::system_clock::now();
    local_70 = local_70 / 1000000000;
    details::os::localtime((os *)&local_68,&local_70);
    daily_filename_calculator::calc_filename(&local_b0,&this->base_filename_,&local_68);
    details::file_helper::open(&this->file_helper_,(char *)&local_b0,(uint)this->truncate_);
    tVar5 = next_rotation_tp_(this);
    (this->rotation_tp_).__d.__r = (rep)tVar5.__d.__r;
    if (this->max_files_ != 0) {
      init_filenames_q_(this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"daily_file_sink: Invalid rotation time in ctor","");
  throw_spdlog_ex(&local_90);
}

Assistant:

daily_file_sink(filename_t base_filename, int rotation_hour, int rotation_minute, bool truncate = false, uint16_t max_files = 0,
        const file_event_handlers &event_handlers = {})
        : base_filename_(std::move(base_filename))
        , rotation_h_(rotation_hour)
        , rotation_m_(rotation_minute)
        , file_helper_{event_handlers}
        , truncate_(truncate)
        , max_files_(max_files)
        , filenames_q_()
    {
        if (rotation_hour < 0 || rotation_hour > 23 || rotation_minute < 0 || rotation_minute > 59)
        {
            throw_spdlog_ex("daily_file_sink: Invalid rotation time in ctor");
        }

        auto now = log_clock::now();
        auto filename = FileNameCalc::calc_filename(base_filename_, now_tm(now));
        file_helper_.open(filename, truncate_);
        rotation_tp_ = next_rotation_tp_();

        if (max_files_ > 0)
        {
            init_filenames_q_();
        }
    }